

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.hpp
# Opt level: O1

bool xercesc_4_0::XMLString::endsWith(XMLCh *toTest,XMLCh *suffix)

{
  short *psVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  XMLSize_t charCount;
  
  charCount = 0;
  if (suffix != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)suffix + charCount);
      charCount = charCount + 2;
    } while (*psVar1 != 0);
    charCount = ((long)charCount >> 1) - 1;
  }
  lVar4 = 0;
  iVar3 = 0;
  if (toTest != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toTest + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    iVar3 = (int)(lVar4 >> 1) + -1;
  }
  bVar2 = regionMatches(toTest,iVar3 - (int)charCount,suffix,0,charCount);
  return bVar2;
}

Assistant:

inline bool XMLString::endsWith(const XMLCh* const toTest,
                                const XMLCh* const suffix)
{

    XMLSize_t suffixLen = XMLString::stringLen(suffix);

    return regionMatches(toTest, (int)(XMLString::stringLen(toTest) - suffixLen),
                         suffix, 0, suffixLen);
}